

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

string * google::protobuf::compiler::python::anon_unknown_0::
         NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *descriptor,string *separator)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,*(string **)descriptor);
  while (descriptor = *(Descriptor **)(descriptor + 0x18), descriptor != (Descriptor *)0x0) {
    std::operator+(&bStack_68,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)descriptor
                   ,separator);
    std::operator+(&local_48,&bStack_68,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&bStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                   const string& separator) {
  string name = descriptor.name();
  for (const Descriptor* current = descriptor.containing_type();
       current != NULL; current = current->containing_type()) {
    name = current->name() + separator + name;
  }
  return name;
}